

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# contour_correspondence.hpp
# Opt level: O1

ContourLandmarks *
eos::fitting::ContourLandmarks::load(ContourLandmarks *__return_storage_ptr__,string *filename)

{
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar1;
  uint uVar2;
  pointer pcVar3;
  basic_value<toml::discard_comments,_std::unordered_map,_std::vector> *pbVar4;
  pointer pbVar5;
  uint uVar6;
  ContourLandmarks *this;
  uint uVar7;
  uint uVar8;
  value_type *this_00;
  _Hashtable<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_toml::basic_value<toml::discard_comments,_std::unordered_map,_std::vector>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_toml::basic_value<toml::discard_comments,_std::unordered_map,_std::vector>_>_>,_std::__detail::_Select1st,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>_>
  *p_Var9;
  const_iterator cVar10;
  type *ptVar11;
  uint *puVar12;
  runtime_error *prVar13;
  undefined8 uVar14;
  ulong uVar15;
  value_t t;
  value_t t_00;
  uint uVar16;
  pointer this_01;
  basic_value<toml::discard_comments,_std::unordered_map,_std::vector> *this_02;
  string value;
  basic_value<toml::discard_comments,_std::unordered_map,_std::vector> data;
  key local_108;
  ContourLandmarks *local_e8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_e0;
  _Hashtable<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_toml::basic_value<toml::discard_comments,_std::unordered_map,_std::vector>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_toml::basic_value<toml::discard_comments,_std::unordered_map,_std::vector>_>_>,_std::__detail::_Select1st,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>_>
  *local_c0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_b8;
  string local_98;
  basic_value<toml::discard_comments,_std::unordered_map,_std::vector> local_78;
  
  pcVar3 = (filename->_M_dataplus)._M_p;
  local_98._M_dataplus._M_p = (pointer)&local_98.field_2;
  std::__cxx11::string::_M_construct<char*>
            ((string *)&local_98,pcVar3,pcVar3 + filename->_M_string_length);
  toml::parse<toml::discard_comments,_std::unordered_map,_std::vector>(&local_78,&local_98);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_98._M_dataplus._M_p != &local_98.field_2) {
    operator_delete(local_98._M_dataplus._M_p,local_98.field_2._M_allocated_capacity + 1);
  }
  paVar1 = &local_108.field_2;
  local_108._M_dataplus._M_p = (pointer)paVar1;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_108,"contour_landmarks","");
  this_00 = toml::basic_value<toml::discard_comments,_std::unordered_map,_std::vector>::at
                      (&local_78,&local_108);
  p_Var9 = &toml::basic_value<toml::discard_comments,_std::unordered_map,_std::vector>::
            cast<(toml::value_t)10>(this_00)->_M_h;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_108._M_dataplus._M_p != paVar1) {
    operator_delete(local_108._M_dataplus._M_p,
                    CONCAT71(local_108.field_2._M_allocated_capacity._1_7_,
                             local_108.field_2._M_local_buf[0]) + 1);
  }
  (__return_storage_ptr__->left_contour).
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  (__return_storage_ptr__->left_contour).
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  (__return_storage_ptr__->right_contour).
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  (__return_storage_ptr__->left_contour).
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  (__return_storage_ptr__->right_contour).
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  (__return_storage_ptr__->right_contour).
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  local_108._M_dataplus._M_p = (pointer)paVar1;
  local_e8 = __return_storage_ptr__;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_108,"right","");
  cVar10 = std::
           _Hashtable<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_toml::basic_value<toml::discard_comments,_std::unordered_map,_std::vector>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_toml::basic_value<toml::discard_comments,_std::unordered_map,_std::vector>_>_>,_std::__detail::_Select1st,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>_>
           ::find(p_Var9,&local_108);
  if (cVar10.
      super__Node_iterator_base<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_toml::basic_value<toml::discard_comments,_std::unordered_map,_std::vector>_>,_true>
      ._M_cur == (__node_type *)0x0) {
    std::__throw_out_of_range("_Map_base::at");
  }
  else {
    ptVar11 = toml::basic_value<toml::discard_comments,_std::unordered_map,_std::vector>::
              cast<(toml::value_t)9>
                        ((basic_value<toml::discard_comments,_std::unordered_map,_std::vector> *)
                         ((long)cVar10.
                                super__Node_iterator_base<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_toml::basic_value<toml::discard_comments,_std::unordered_map,_std::vector>_>,_true>
                                ._M_cur + 0x28));
    local_c0 = p_Var9;
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_108._M_dataplus._M_p != paVar1) {
      operator_delete(local_108._M_dataplus._M_p,
                      CONCAT71(local_108.field_2._M_allocated_capacity._1_7_,
                               local_108.field_2._M_local_buf[0]) + 1);
    }
    pbVar4 = (ptVar11->
             super__Vector_base<toml::basic_value<toml::discard_comments,_std::unordered_map,_std::vector>,_std::allocator<toml::basic_value<toml::discard_comments,_std::unordered_map,_std::vector>_>_>
             )._M_impl.super__Vector_impl_data._M_finish;
    for (this_02 = (ptVar11->
                   super__Vector_base<toml::basic_value<toml::discard_comments,_std::unordered_map,_std::vector>,_std::allocator<toml::basic_value<toml::discard_comments,_std::unordered_map,_std::vector>_>_>
                   )._M_impl.super__Vector_impl_data._M_start; this_02 != pbVar4;
        this_02 = this_02 + 1) {
      local_108._M_dataplus._M_p = (pointer)&local_108.field_2;
      local_108._M_string_length = 0;
      local_108.field_2._M_local_buf[0] = '\0';
      if (this_02->type_ == string) {
        toml::basic_value<toml::discard_comments,_std::unordered_map,_std::vector>::as_string
                  (this_02);
        std::__cxx11::string::_M_assign((string *)&local_108);
      }
      else {
        if (this_02->type_ != integer) {
          prVar13 = (runtime_error *)__cxa_allocate_exception(0x10);
          toml::stringize<char,std::char_traits<char>,std::allocator<char>>
                    (&local_b8,(toml *)(ulong)this_02->type_,t);
          std::operator+(&local_e0,"unexpected type : ",&local_b8);
          std::runtime_error::runtime_error(prVar13,(string *)&local_e0);
          __cxa_throw(prVar13,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
        }
        puVar12 = (uint *)toml::basic_value<toml::discard_comments,_std::unordered_map,_std::vector>
                          ::as_integer(this_02);
        uVar2 = *puVar12;
        uVar6 = -uVar2;
        if (0 < (int)uVar2) {
          uVar6 = uVar2;
        }
        uVar16 = 1;
        if (9 < uVar6) {
          uVar15 = (ulong)uVar6;
          uVar7 = 4;
          do {
            uVar16 = uVar7;
            uVar8 = (uint)uVar15;
            if (uVar8 < 100) {
              uVar16 = uVar16 - 2;
              goto LAB_0010d3c6;
            }
            if (uVar8 < 1000) {
              uVar16 = uVar16 - 1;
              goto LAB_0010d3c6;
            }
            if (uVar8 < 10000) goto LAB_0010d3c6;
            uVar15 = uVar15 / 10000;
            uVar7 = uVar16 + 4;
          } while (99999 < uVar8);
          uVar16 = uVar16 + 1;
        }
LAB_0010d3c6:
        local_e0._M_dataplus._M_p = (pointer)&local_e0.field_2;
        std::__cxx11::string::_M_construct
                  ((ulong)&local_e0,(char)uVar16 - (char)((int)uVar2 >> 0x1f));
        std::__detail::__to_chars_10_impl<unsigned_int>
                  (local_e0._M_dataplus._M_p + (uVar2 >> 0x1f),uVar16,uVar6);
        std::__cxx11::string::operator=((string *)&local_108,(string *)&local_e0);
        __return_storage_ptr__ = local_e8;
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_e0._M_dataplus._M_p != &local_e0.field_2) {
          operator_delete(local_e0._M_dataplus._M_p,local_e0.field_2._M_allocated_capacity + 1);
          __return_storage_ptr__ = local_e8;
        }
      }
      std::
      vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ::push_back(&__return_storage_ptr__->right_contour,&local_108);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_108._M_dataplus._M_p != &local_108.field_2) {
        operator_delete(local_108._M_dataplus._M_p,
                        CONCAT71(local_108.field_2._M_allocated_capacity._1_7_,
                                 local_108.field_2._M_local_buf[0]) + 1);
      }
    }
    local_108._M_dataplus._M_p = (pointer)&local_108.field_2;
    std::__cxx11::string::_M_construct<char_const*>((string *)&local_108,"left","");
    cVar10 = std::
             _Hashtable<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_toml::basic_value<toml::discard_comments,_std::unordered_map,_std::vector>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_toml::basic_value<toml::discard_comments,_std::unordered_map,_std::vector>_>_>,_std::__detail::_Select1st,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>_>
             ::find(local_c0,&local_108);
    if (cVar10.
        super__Node_iterator_base<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_toml::basic_value<toml::discard_comments,_std::unordered_map,_std::vector>_>,_true>
        ._M_cur != (__node_type *)0x0) {
      ptVar11 = toml::basic_value<toml::discard_comments,_std::unordered_map,_std::vector>::
                cast<(toml::value_t)9>
                          ((basic_value<toml::discard_comments,_std::unordered_map,_std::vector> *)
                           ((long)cVar10.
                                  super__Node_iterator_base<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_toml::basic_value<toml::discard_comments,_std::unordered_map,_std::vector>_>,_true>
                                  ._M_cur + 0x28));
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_108._M_dataplus._M_p != &local_108.field_2) {
        operator_delete(local_108._M_dataplus._M_p,
                        CONCAT71(local_108.field_2._M_allocated_capacity._1_7_,
                                 local_108.field_2._M_local_buf[0]) + 1);
      }
      this_01 = (ptVar11->
                super__Vector_base<toml::basic_value<toml::discard_comments,_std::unordered_map,_std::vector>,_std::allocator<toml::basic_value<toml::discard_comments,_std::unordered_map,_std::vector>_>_>
                )._M_impl.super__Vector_impl_data._M_start;
      pbVar5 = (ptVar11->
               super__Vector_base<toml::basic_value<toml::discard_comments,_std::unordered_map,_std::vector>,_std::allocator<toml::basic_value<toml::discard_comments,_std::unordered_map,_std::vector>_>_>
               )._M_impl.super__Vector_impl_data._M_finish;
      if (this_01 != pbVar5) {
        p_Var9 = (_Hashtable<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_toml::basic_value<toml::discard_comments,_std::unordered_map,_std::vector>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_toml::basic_value<toml::discard_comments,_std::unordered_map,_std::vector>_>_>,_std::__detail::_Select1st,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>_>
                  *)&local_e8->left_contour;
        local_c0 = p_Var9;
        do {
          local_108._M_dataplus._M_p = (pointer)&local_108.field_2;
          local_108._M_string_length = 0;
          local_108.field_2._M_local_buf[0] = '\0';
          if (this_01->type_ == string) {
            toml::basic_value<toml::discard_comments,_std::unordered_map,_std::vector>::as_string
                      (this_01);
            std::__cxx11::string::_M_assign((string *)&local_108);
          }
          else {
            if (this_01->type_ != integer) {
              prVar13 = (runtime_error *)__cxa_allocate_exception(0x10);
              toml::stringize<char,std::char_traits<char>,std::allocator<char>>
                        (&local_b8,(toml *)(ulong)this_01->type_,t_00);
              std::operator+(&local_e0,"unexpected type : ",&local_b8);
              std::runtime_error::runtime_error(prVar13,(string *)&local_e0);
              __cxa_throw(prVar13,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
            }
            puVar12 = (uint *)toml::
                              basic_value<toml::discard_comments,_std::unordered_map,_std::vector>::
                              as_integer(this_01);
            uVar2 = *puVar12;
            uVar6 = -uVar2;
            if (0 < (int)uVar2) {
              uVar6 = uVar2;
            }
            uVar16 = 1;
            if (9 < uVar6) {
              uVar15 = (ulong)uVar6;
              uVar7 = 4;
              do {
                uVar16 = uVar7;
                uVar8 = (uint)uVar15;
                if (uVar8 < 100) {
                  uVar16 = uVar16 - 2;
                  goto LAB_0010d56e;
                }
                if (uVar8 < 1000) {
                  uVar16 = uVar16 - 1;
                  goto LAB_0010d56e;
                }
                if (uVar8 < 10000) goto LAB_0010d56e;
                uVar15 = uVar15 / 10000;
                uVar7 = uVar16 + 4;
              } while (99999 < uVar8);
              uVar16 = uVar16 + 1;
            }
LAB_0010d56e:
            local_e0._M_dataplus._M_p = (pointer)&local_e0.field_2;
            std::__cxx11::string::_M_construct
                      ((ulong)&local_e0,(char)uVar16 - (char)((int)uVar2 >> 0x1f));
            std::__detail::__to_chars_10_impl<unsigned_int>
                      (local_e0._M_dataplus._M_p + (uVar2 >> 0x1f),uVar16,uVar6);
            std::__cxx11::string::operator=((string *)&local_108,(string *)&local_e0);
            p_Var9 = local_c0;
            if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)local_e0._M_dataplus._M_p != &local_e0.field_2) {
              operator_delete(local_e0._M_dataplus._M_p,local_e0.field_2._M_allocated_capacity + 1);
              p_Var9 = local_c0;
            }
          }
          std::
          vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          ::push_back((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                       *)p_Var9,&local_108);
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_108._M_dataplus._M_p != &local_108.field_2) {
            operator_delete(local_108._M_dataplus._M_p,
                            CONCAT71(local_108.field_2._M_allocated_capacity._1_7_,
                                     local_108.field_2._M_local_buf[0]) + 1);
          }
          this_01 = this_01 + 1;
        } while (this_01 != pbVar5);
      }
      toml::basic_value<toml::discard_comments,_std::unordered_map,_std::vector>::~basic_value
                (&local_78);
      return local_e8;
    }
  }
  uVar14 = std::__throw_out_of_range("_Map_base::at");
  this = local_e8;
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~vector(&local_e8->left_contour);
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~vector(&this->right_contour);
  toml::basic_value<toml::discard_comments,_std::unordered_map,_std::vector>::~basic_value
            (&local_78);
  _Unwind_Resume(uVar14);
}

Assistant:

static ContourLandmarks load(std::string filename)
    {
        // parse() as well as extracting the data can throw std::runtime error or toml::exception,
        // so ideally you'd want to call this c'tor within a try-catch.
        const auto data = toml::parse(filename);

        // Todo: Handle the case when '[contour_landmarks]' is empty - now it just throws. Use
        // std::unordered_map::count.
        const auto& contour_table = toml::get<toml::table>(data.at("contour_landmarks"));

        ContourLandmarks contour;
        // There might be a vector<string> or a vector<int>, we need to check for that and convert to vector<string>.
        // Todo: Again, check whether the key exists first.
        // Read all the "right" contour landmarks:
        const auto& right_contour = toml::get<std::vector<toml::value>>(contour_table.at("right"));
        for (const auto& landmark : right_contour)
        {
            std::string value;
            switch (landmark.type())
            {
            case toml::value_t::integer:
                value = std::to_string(toml::get<int>(landmark));
                break;
            case toml::value_t::string:
                value = toml::get<std::string>(landmark);
                break;
            default:
                throw std::runtime_error("unexpected type : " + toml::stringize(landmark.type()));
            }
            contour.right_contour.push_back(value);
        }
        // Now the same for all the "left" contour landmarks:
        const auto& left_contour = toml::get<std::vector<toml::value>>(contour_table.at("left"));
        for (const auto& landmark : left_contour)
        {
            std::string value;
            switch (landmark.type())
            {
            case toml::value_t::integer:
                value = std::to_string(toml::get<int>(landmark));
                break;
            case toml::value_t::string:
                value = toml::get<std::string>(landmark);
                break;
            default:
                throw std::runtime_error("unexpected type : " + toml::stringize(landmark.type()));
            }
            contour.left_contour.push_back(value);
        }

        return contour;
    }